

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source-map.cpp
# Opt level: O0

optional<wasm::Function::DebugLocation> * __thiscall
wasm::SourceMapReader::readDebugLocationAt
          (optional<wasm::Function::DebugLocation> *__return_storage_ptr__,SourceMapReader *this,
          size_t currLocation)

{
  bool bVar1;
  char cVar2;
  int32_t iVar3;
  MapParseException *pMVar4;
  DebugLocation local_98;
  _Optional_payload_base<unsigned_int> local_84;
  optional<unsigned_int> sym;
  allocator<char> local_41;
  string local_40;
  char local_19;
  size_t sStack_18;
  char next;
  size_t currLocation_local;
  SourceMapReader *this_local;
  
  sStack_18 = currLocation;
  currLocation_local = (size_t)this;
  do {
    bVar1 = false;
    if (this->location != 0) {
      bVar1 = this->location <= sStack_18;
    }
    if (!bVar1) {
LAB_02598675:
      if ((this->hasInfo & 1U) == 0) {
        std::optional<wasm::Function::DebugLocation>::optional(__return_storage_ptr__);
      }
      else {
        if ((this->hasSymbol & 1U) == 0) {
          std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_84);
        }
        else {
          std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                    ((optional<unsigned_int> *)&local_84,&this->symbol);
        }
        local_98.fileIndex = this->file;
        local_98.lineNumber = this->line;
        local_98.columnNumber = this->col;
        local_98.symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_base<unsigned_int,_true,_true>)
             (_Optional_base<unsigned_int,_true,_true>)local_84;
        std::optional<wasm::Function::DebugLocation>::optional<wasm::Function::DebugLocation,_true>
                  (__return_storage_ptr__,&local_98);
      }
      return __return_storage_ptr__;
    }
    local_19 = peek(this);
    if ((local_19 == ',') || (local_19 == '\"')) {
      this->hasInfo = false;
    }
    else {
      this->hasInfo = true;
      iVar3 = readBase64VLQ(this);
      this->file = iVar3 + this->file;
      iVar3 = readBase64VLQ(this);
      this->line = iVar3 + this->line;
      iVar3 = readBase64VLQ(this);
      this->col = iVar3 + this->col;
      local_19 = peek(this);
      if (local_19 == ';') {
        pMVar4 = (MapParseException *)__cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Unexpected mapping for 2nd generated line",&local_41);
        MapParseException::MapParseException(pMVar4,&local_40);
        __cxa_throw(pMVar4,&MapParseException::typeinfo,MapParseException::~MapParseException);
      }
      if ((local_19 == ',') || (local_19 == '\"')) {
        this->hasSymbol = false;
      }
      else {
        this->hasSymbol = true;
        iVar3 = readBase64VLQ(this);
        this->symbol = iVar3 + this->symbol;
      }
    }
    cVar2 = peek(this);
    if (cVar2 == '\"') {
      this->location = 0;
      goto LAB_02598675;
    }
    cVar2 = get(this);
    if (cVar2 != ',') {
      sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ = 1;
      pMVar4 = (MapParseException *)__cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_engaged,"Expected delimiter",
                 (allocator<char> *)
                 ((long)&sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_payload + 3));
      MapParseException::MapParseException
                (pMVar4,(string *)
                        &sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                         super__Optional_payload_base<unsigned_int>._M_engaged);
      sym.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value._2_1_ = 0;
      __cxa_throw(pMVar4,&MapParseException::typeinfo,MapParseException::~MapParseException);
    }
    iVar3 = readBase64VLQ(this);
    this->location = (long)iVar3 + this->location;
  } while( true );
}

Assistant:

std::optional<Function::DebugLocation>
SourceMapReader::readDebugLocationAt(size_t currLocation) {
  while (location && location <= currLocation) {
    do {
      char next = peek();
      if (next == ',' || next == '\"') {
        // This is a 1-length entry, so the next location has no debug info.
        hasInfo = false;
        break;
      }

      hasInfo = true;
      file += readBase64VLQ();
      line += readBase64VLQ();
      col += readBase64VLQ();

      next = peek();
      if (next == ';') {
        // Generated JS files can have multiple lines, and mappings for each
        // line are separated by ';'. Wasm files do not have lines, so there
        // should be only one generated "line".
        throw MapParseException("Unexpected mapping for 2nd generated line");
      }
      if (next == ',' || next == '\"') {
        hasSymbol = false;
        break;
      }

      hasSymbol = true;
      symbol += readBase64VLQ();

    } while (false);

    // Check whether there is another record to read the position for.

    if (peek() == '\"') {
      // End of records.
      location = 0;
      break;
    }
    if (get() != ',') {
      throw MapParseException("Expected delimiter");
    }

    // Set up for the next record.
    location += readBase64VLQ();
  }

  if (!hasInfo) {
    return std::nullopt;
  }
  auto sym = hasSymbol ? symbol : std::optional<uint32_t>{};
  return Function::DebugLocation{file, line, col, sym};
}